

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImDrawDataBuilder::ClearFreeMemory(ImDrawDataBuilder *this)

{
  void *pvVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    pvVar1 = *(void **)((long)&this->Layers[0].Data + lVar2);
    if (pvVar1 != (void *)0x0) {
      *(undefined8 *)((long)&this->Layers[0].Size + lVar2) = 0;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(pvVar1,GImAllocatorUserData);
      *(undefined8 *)((long)&this->Layers[0].Data + lVar2) = 0;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 == 0x10);
  return;
}

Assistant:

void ClearFreeMemory()  { for (int n = 0; n < IM_ARRAYSIZE(Layers); n++) Layers[n].clear(); }